

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppTVar8;
  pointer ppTVar9;
  TimeInMillis ms;
  TimeInMillis ms_00;
  UnitTestImpl *pUVar10;
  uint uVar11;
  long lVar12;
  string kIndent;
  string kTestsuites;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"testsuites","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"tests","");
  iVar6 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_50,&local_b0,iVar6,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"failures","");
  iVar6 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_50,&local_b0,iVar6,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"disabled","");
  iVar6 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_50,&local_b0,iVar6,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"errors","");
  OutputJsonKey(stream,&local_50,&local_b0,0,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"random_seed","");
    OutputJsonKey(stream,&local_50,&local_b0,unit_test->impl_->random_seed_,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"timestamp","");
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_70,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,&local_50,&local_b0,&local_70,&local_90,true);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_70,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputJsonKey(stream,&local_50,&local_b0,&local_70,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  TestPropertiesAsJson(&local_b0,&unit_test->impl_->ad_hoc_test_result_,&local_90);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AllTests","");
  OutputJsonKey(stream,&local_50,&local_b0,&local_70,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": [\n",5);
  pUVar10 = unit_test->impl_;
  ppTVar8 = (pUVar10->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = false;
  if (0 < (int)((ulong)((long)(pUVar10->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3)) {
    lVar12 = 0;
    bVar4 = false;
    do {
      ppTVar9 = (ppTVar8[lVar12]->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = *(pointer *)
                 ((long)&(ppTVar8[lVar12]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar9 != ppTVar3) {
        iVar6 = 0;
        do {
          uVar11 = (*ppTVar9)->is_in_another_shard_ ^ 1;
          if ((*ppTVar9)->matches_filter_ == false) {
            uVar11 = 0;
          }
          iVar6 = iVar6 + uVar11;
          ppTVar9 = ppTVar9 + 1;
        } while (ppTVar9 != ppTVar3);
        if (iVar6 != 0) {
          bVar5 = true;
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar10 = unit_test->impl_;
            bVar5 = bVar4;
          }
          bVar4 = bVar5;
          PrintJsonTestSuite(stream,(pUVar10->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar12]);
          pUVar10 = unit_test->impl_;
        }
      }
      lVar12 = lVar12 + 1;
      ppTVar8 = (pUVar10->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(pUVar10->test_suites_).
                                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8
                                   ) >> 3));
  }
  bVar5 = TestResult::Failed(&pUVar10->ad_hoc_test_result_);
  if (bVar5) {
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
    }
    OutputJsonTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG_GET(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}